

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arguments.cpp
# Opt level: O1

Arguments * __thiscall
Corrade::Utility::Arguments::setHelp(Arguments *this,string *key,string *help,string *helpKey)

{
  size_type *psVar1;
  ulong uVar2;
  Type TVar3;
  Entry *pEVar4;
  long *plVar5;
  undefined8 *puVar6;
  ostream *poVar7;
  Debug *pDVar8;
  ulong *puVar9;
  ulong uVar10;
  size_type sVar11;
  undefined1 local_a0 [40];
  ulong *local_78;
  long local_70;
  ulong local_68;
  long lStack_60;
  Arguments *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                 &this->_prefix,key);
  local_58 = this;
  pEVar4 = find(this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
  if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
    operator_delete((void *)local_a0._0_8_);
  }
  if (pEVar4 == (Entry *)0x0) {
    poVar7 = Error::defaultOutput();
    Error::Error((Error *)local_a0,poVar7,(Flags)0x0);
    pDVar8 = Debug::operator<<((Debug *)local_a0,"Utility::Arguments::setHelp(): key");
    pDVar8 = Implementation::debugPrintStlString(pDVar8,key);
    Debug::operator<<(pDVar8,"not found");
LAB_00109e64:
    Error::~Error((Error *)local_a0);
    abort();
  }
  std::__cxx11::string::operator=((string *)&pEVar4->help,(string *)help);
  if (helpKey->_M_string_length == 0) {
    return local_58;
  }
  TVar3 = pEVar4->type;
  if (2 < TVar3 - 2) {
    if (TVar3 < NamedArgument) {
      std::__cxx11::string::operator=((string *)&pEVar4->helpKey,(string *)helpKey);
      return local_58;
    }
    if (TVar3 == BooleanOption) {
      poVar7 = Error::defaultOutput();
      Error::Error((Error *)local_a0,poVar7,(Flags)0x0);
      pDVar8 = Debug::operator<<((Debug *)local_a0,
                                 "Utility::Arguments::setHelp(): help key can\'t be set for boolean option"
                                );
      operator<<<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (pDVar8,key);
    }
    else {
      poVar7 = Error::defaultOutput();
      Error::Error((Error *)local_a0,poVar7,(Flags)0x0);
      Debug::operator<<((Debug *)local_a0,
                        "Assertion found->type == Type::Argument || found->type == Type::ArrayArgument failed at /workspace/llm4binary/github/license_c_cmakelists/mosra[P]corrade/src/Corrade/Utility/Arguments.cpp:468"
                       );
    }
    goto LAB_00109e64;
  }
  std::operator+(&local_50,&this->_prefix,key);
  plVar5 = (long *)std::__cxx11::string::_M_replace_aux
                             ((ulong)&local_50,local_50._M_string_length,0,'\x01');
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_68 = *puVar9;
    lStack_60 = plVar5[3];
    local_78 = &local_68;
  }
  else {
    local_68 = *puVar9;
    local_78 = (ulong *)*plVar5;
  }
  local_70 = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  uVar2 = helpKey->_M_string_length + local_70;
  uVar10 = 0xf;
  if (local_78 != &local_68) {
    uVar10 = local_68;
  }
  if (uVar10 < uVar2) {
    sVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(helpKey->_M_dataplus)._M_p != &helpKey->field_2) {
      sVar11 = (helpKey->field_2)._M_allocated_capacity;
    }
    if (uVar2 <= sVar11) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)helpKey,0,(char *)0x0,(ulong)local_78);
      goto LAB_00109d28;
    }
  }
  puVar6 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_78,(ulong)(helpKey->_M_dataplus)._M_p);
LAB_00109d28:
  psVar1 = puVar6 + 2;
  if ((size_type *)*puVar6 == psVar1) {
    local_a0._16_8_ = *psVar1;
    local_a0._24_8_ = puVar6[3];
    local_a0._0_8_ = local_a0 + 0x10;
  }
  else {
    local_a0._16_8_ = *psVar1;
    local_a0._0_8_ = (size_type *)*puVar6;
  }
  local_a0._8_8_ = puVar6[1];
  *puVar6 = psVar1;
  puVar6[1] = 0;
  *(char *)psVar1 = '\0';
  std::__cxx11::string::operator=((string *)&pEVar4->helpKey,(string *)local_a0);
  if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
    operator_delete((void *)local_a0._0_8_);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return local_58;
}

Assistant:

Arguments& Arguments::setHelp(const std::string& key, std::string help, std::string helpKey) {
    Entry* found = find(_prefix + key);
    CORRADE_ASSERT(found, "Utility::Arguments::setHelp(): key" << key << "not found", *this);

    found->help = std::move(help);

    if(!helpKey.empty()) {
        CORRADE_ASSERT(found->type != Type::BooleanOption,
            "Utility::Arguments::setHelp(): help key can't be set for boolean option" << key, *this);

        if(found->type == Type::NamedArgument || found->type == Type::Option || found->type == Type::ArrayOption)
            found->helpKey = _prefix + key + ' ' + std::move(helpKey);
        else {
            CORRADE_INTERNAL_ASSERT(found->type == Type::Argument || found->type == Type::ArrayArgument);
            found->helpKey = std::move(helpKey);
        }
    }

    return *this;
}